

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

Pixel * __thiscall olc::Pixel::operator/=(Pixel *this,float i)

{
  anon_struct_4_4_d83cdc77_for_anon_union_4_2_12391da5_for_Pixel_0_1 aVar1;
  undefined1 auVar2 [13];
  undefined4 in_ECX;
  uint uVar3;
  int iVar4;
  int iVar5;
  float fVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar9 [16];
  
  aVar1 = (this->field_0).field_1;
  auVar2[0xc] = aVar1.a;
  auVar2._0_12_ = ZEXT712(0);
  auVar6._0_4_ = (float)((uint)aVar1 & 0xff);
  auVar6._4_4_ = (float)((uint)aVar1 >> 8 & 0xff);
  auVar6._8_4_ = (float)(int)CONCAT32(auVar2._10_3_,(ushort)aVar1.b);
  auVar6._12_4_ = (float)(uint3)(auVar2._10_3_ >> 0x10);
  auVar7._4_4_ = i;
  auVar7._0_4_ = i;
  auVar7._8_4_ = i;
  auVar7._12_4_ = i;
  auVar7 = divps(auVar6,auVar7);
  fVar11 = auVar7._0_4_;
  fVar8 = auVar7._4_4_;
  iVar4 = -(uint)(0.0 < fVar11);
  iVar5 = -(uint)(0.0 < fVar8);
  auVar10._4_4_ = iVar5;
  auVar10._0_4_ = iVar4;
  auVar10._8_4_ = iVar5;
  auVar10._12_4_ = iVar5;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._4_4_ = iVar4;
  auVar9._0_4_ = iVar4;
  uVar3 = movmskpd(in_ECX,auVar9);
  if ((uVar3 & 1) == 0) {
    fVar11 = 0.0;
  }
  if (255.0 <= fVar11) {
    fVar11 = 255.0;
  }
  (this->field_0).field_1.r = (uint8_t)(int)fVar11;
  if ((uVar3 & 2) == 0) {
    fVar8 = 0.0;
  }
  if (255.0 <= fVar8) {
    fVar8 = 255.0;
  }
  (this->field_0).field_1.g = (uint8_t)(int)fVar8;
  fVar11 = (float)(this->field_0).field_1.b / i;
  if (fVar11 <= 0.0) {
    fVar11 = 0.0;
  }
  if (255.0 <= fVar11) {
    fVar11 = 255.0;
  }
  (this->field_0).field_1.b = (uint8_t)(int)fVar11;
  return this;
}

Assistant:

Pixel& Pixel::operator /=(const float i)
	{
		this->r = uint8_t(std::min(255.0f, std::max(0.0f, float(r) / i)));
		this->g = uint8_t(std::min(255.0f, std::max(0.0f, float(g) / i)));
		this->b = uint8_t(std::min(255.0f, std::max(0.0f, float(b) / i)));
		return *this;
	}